

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outrec)

{
  bool bVar1;
  code cVar2;
  OutPt *pOVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  OutPt *pOVar11;
  OutPt *pOVar12;
  OutPt *pOVar13;
  bool bVar14;
  OutPt *local_38;
  
  outrec->BottomPt = (OutPt *)0x0;
  pOVar13 = outrec->Pts;
  pOVar12 = pOVar13->Prev;
  if (pOVar12 != pOVar13) {
    bVar1 = this->m_StrictSimple;
    cVar2 = (this->_vptr_Clipper[-3] + 0x10)
            [(long)&(this->m_IntersectList).
                    super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
            ];
    pOVar11 = (OutPt *)0x0;
    do {
      pOVar3 = pOVar13->Next;
      if (pOVar12 == pOVar3) break;
      lVar4 = (pOVar13->Pt).X;
      lVar5 = (pOVar13->Pt).Y;
      lVar6 = (pOVar3->Pt).X;
      lVar7 = (pOVar3->Pt).Y;
      if (lVar5 == lVar7 && lVar4 == lVar6) {
LAB_00291d08:
        pOVar12->Next = pOVar3;
        pOVar13->Next->Prev = pOVar12;
        pOVar3 = pOVar13->Prev;
        operator_delete(pOVar13,0x28);
        pOVar11 = (OutPt *)0x0;
      }
      else {
        lVar8 = (pOVar12->Pt).X;
        lVar9 = (pOVar12->Pt).Y;
        if ((lVar4 == lVar8) && (lVar5 == lVar9)) goto LAB_00291d08;
        bVar10 = SlopesEqual(pOVar12->Pt,pOVar13->Pt,pOVar3->Pt,
                             (bool)(this->_vptr_Clipper[-3] + 8)
                                   [(long)&(this->m_GhostJoins).
                                           super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                   ]);
        if (bVar10) {
          if ((((bVar1 | (byte)cVar2) & 1) != 0) && ((lVar8 != lVar6 || (lVar9 != lVar7)))) {
            if (lVar8 == lVar6) {
              bVar10 = lVar9 < lVar5;
              bVar14 = SBORROW8(lVar5,lVar7);
              lVar5 = lVar5 - lVar7;
            }
            else {
              bVar10 = lVar8 < lVar4;
              bVar14 = SBORROW8(lVar4,lVar6);
              lVar5 = lVar4 - lVar6;
            }
            if ((bool)(bVar14 == lVar5 < 0 ^ bVar10)) goto LAB_00291ddd;
          }
          goto LAB_00291d08;
        }
LAB_00291ddd:
        if (pOVar13 == pOVar11) goto LAB_00291e01;
        if (pOVar11 == (OutPt *)0x0) {
          pOVar11 = pOVar13;
        }
      }
      pOVar13 = pOVar3;
      pOVar12 = pOVar13->Prev;
    } while (pOVar12 != pOVar13);
  }
  local_38 = pOVar13;
  DisposeOutPts(&local_38);
  pOVar13 = (OutPt *)0x0;
LAB_00291e01:
  outrec->Pts = pOVar13;
  return;
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outrec)
{
    //FixupOutPolygon() - removes duplicate points and simplifies consecutive
    //parallel edges by removing the middle vertex.
    OutPt *lastOK = 0;
    outrec.BottomPt = 0;
    OutPt *pp = outrec.Pts;
    bool preserveCol = m_PreserveCollinear || m_StrictSimple;

    for (;;)
    {
        if (pp->Prev == pp || pp->Prev == pp->Next)
        {
            DisposeOutPts(pp);
            outrec.Pts = 0;
            return;
        }

        //test for duplicate points and collinear edges ...
        if ((pp->Pt == pp->Next->Pt) || (pp->Pt == pp->Prev->Pt) ||
            (SlopesEqual(pp->Prev->Pt, pp->Pt, pp->Next->Pt, m_UseFullRange) &&
            (!preserveCol || !Pt2IsBetweenPt1AndPt3(pp->Prev->Pt, pp->Pt, pp->Next->Pt))))
        {
            lastOK = 0;
            OutPt *tmp = pp;
            pp->Prev->Next = pp->Next;
            pp->Next->Prev = pp->Prev;
            pp = pp->Prev;
            delete tmp;
        }
        else if (pp == lastOK) break;
        else
        {
            if (!lastOK) lastOK = pp;
            pp = pp->Next;
        }
    }
    outrec.Pts = pp;
}